

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

bool __thiscall Rml::Element::SetProperty(Element *this,String *name,String *value)

{
  NodePtr pDVar1;
  ulong uVar2;
  ulong *puVar3;
  bool bVar4;
  bool bVar5;
  PropertyMap *this_00;
  ulong uVar7;
  pair<Rml::PropertyId,_Rml::Property> *property;
  uint8_t *puVar8;
  ulong *puVar9;
  const_iterator cVar10;
  PropertyDictionary properties;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  TStack_58;
  NodePtr pDVar6;
  
  PropertyDictionary::PropertyDictionary((PropertyDictionary *)&TStack_58);
  bVar4 = StyleSheetSpecification::ParsePropertyDeclaration
                    ((PropertyDictionary *)&TStack_58,name,value);
  if (bVar4) {
    this_00 = PropertyDictionary::GetProperties((PropertyDictionary *)&TStack_58);
    cVar10 = robin_hood::detail::
             Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
             ::cbegin(this_00);
    pDVar6 = cVar10.mKeyVals;
    pDVar1 = (NodePtr)this_00->mInfo;
    while (bVar4 = pDVar6 == pDVar1, !bVar4) {
      puVar8 = cVar10.mInfo;
      pDVar6 = cVar10.mKeyVals;
      bVar5 = ElementStyle::SetProperty
                        (&this->meta->style,(pDVar6->mData).first,&(pDVar6->mData).second);
      if (!bVar5) break;
      pDVar6 = pDVar6 + 1;
      uVar7 = *(ulong *)(puVar8 + 1);
      if (uVar7 == 0) {
        puVar3 = (ulong *)(puVar8 + 9);
        do {
          puVar9 = puVar3;
          pDVar6 = pDVar6 + 8;
          uVar7 = *puVar9;
          puVar3 = puVar9 + 1;
        } while (uVar7 == 0);
      }
      else {
        puVar9 = (ulong *)(puVar8 + 1);
      }
      uVar2 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar7 = uVar2 >> 3 & 0x1fffffff;
      pDVar6 = pDVar6 + uVar7;
      cVar10.mInfo = (uint8_t *)((long)puVar9 + uVar7);
      cVar10.mKeyVals = pDVar6;
    }
  }
  else {
    bVar4 = false;
    Log::Message(LT_WARNING,"Syntax error parsing inline property declaration \'%s: %s;\'.",
                 (name->_M_dataplus)._M_p,(value->_M_dataplus)._M_p);
  }
  robin_hood::detail::
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  ::destroy(&TStack_58);
  return bVar4;
}

Assistant:

bool Element::SetProperty(const String& name, const String& value)
{
	// The name may be a shorthand giving us multiple underlying properties
	PropertyDictionary properties;
	if (!StyleSheetSpecification::ParsePropertyDeclaration(properties, name, value))
	{
		Log::Message(Log::LT_WARNING, "Syntax error parsing inline property declaration '%s: %s;'.", name.c_str(), value.c_str());
		return false;
	}
	for (auto& property : properties.GetProperties())
	{
		if (!meta->style.SetProperty(property.first, property.second))
			return false;
	}
	return true;
}